

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int sam_open_mode(char *mode,char *fn,char *format)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  
  if (format == (char *)0x0) {
    if (fn == (char *)0x0) {
      return -1;
    }
    __s = strrchr(fn,0x2e);
    if (__s == (char *)0x0) {
      return -1;
    }
    pcVar2 = strchr(__s,0x2f);
    if (pcVar2 != (char *)0x0) {
      return -1;
    }
    format = __s + 1;
  }
  iVar1 = strcmp(format,"bam");
  if (iVar1 == 0) {
    mode[0] = 'b';
    mode[1] = '\0';
  }
  else {
    iVar1 = strcmp(format,"cram");
    if (iVar1 == 0) {
      mode[0] = 'c';
      mode[1] = '\0';
    }
    else {
      iVar1 = strcmp(format,"sam");
      if (iVar1 != 0) {
        return -1;
      }
      *mode = '\0';
    }
  }
  return 0;
}

Assistant:

int sam_open_mode(char *mode, const char *fn, const char *format)
{
    // TODO Parse "bam5" etc for compression level
    if (format == NULL) {
        // Try to pick a format based on the filename extension
        const char *ext = fn? strrchr(fn, '.') : NULL;
        if (ext == NULL || strchr(ext, '/')) return -1;
        return sam_open_mode(mode, fn, ext+1);
    }
    else if (strcmp(format, "bam") == 0) strcpy(mode, "b");
    else if (strcmp(format, "cram") == 0) strcpy(mode, "c");
    else if (strcmp(format, "sam") == 0) strcpy(mode, "");
    else return -1;

    return 0;
}